

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  undefined8 uVar2;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string_t value;
  string *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  parser_info_t<cfgfile::string_trait_t> *in_stack_fffffffffffffcf8;
  string_t *what;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd00;
  exception_t<cfgfile::string_trait_t> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  string_t local_2a9 [3];
  exception_t<cfgfile::string_trait_t> local_241 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_159 [10];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined(in_stack_fffffffffffffd00);
  if (!bVar1) {
    format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::from_string(in_stack_fffffffffffffcf8,(string_t *)&stack0xfffffffffffffd30);
    std::__cxx11::string::append((string *)(in_RDI + 1));
    tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x30);
  __rhs = local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_RDI,(allocator<char> *)__rhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+(&in_stack_fffffffffffffcf8->m_file_name,in_stack_fffffffffffffcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_RDI,(allocator<char> *)__rhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(&in_stack_fffffffffffffcf8->m_file_name,in_stack_fffffffffffffcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_RDI,(allocator<char> *)__rhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+(&in_stack_fffffffffffffcf8->m_file_name,in_stack_fffffffffffffcf0);
  this_00 = local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_RDI,(allocator<char> *)__rhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  what = local_2a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_RDI,(allocator<char> *)__rhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,what);
  __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const typename Trait::string_t value =
			format_t< typename Trait::string_t, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}